

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

bool __thiscall wallet::SelectionResult::operator<(SelectionResult *this,SelectionResult *other)

{
  long lVar1;
  long *plVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  int line;
  char *in_stack_ffffffffffffffd0;
  long lVar5;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  bool bVar6;
  
  line = (int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::optional<long>::has_value((optional<long> *)in_stack_ffffffffffffff98);
  inline_assertion_check<true,bool>
            ((bool *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd0,line,in_RDI,
             (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  std::optional<long>::has_value((optional<long> *)in_stack_ffffffffffffff98);
  inline_assertion_check<true,bool>
            ((bool *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd0,line,in_RDI,
             (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  plVar2 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffff98);
  lVar5 = *plVar2;
  plVar2 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffff98);
  bVar6 = true;
  if (*plVar2 <= lVar5) {
    plVar2 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffff98);
    lVar5 = *plVar2;
    plVar2 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffff98);
    bVar6 = false;
    if (lVar5 == *plVar2) {
      sVar3 = std::
              set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
              ::size(in_stack_ffffffffffffff98);
      sVar4 = std::
              set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
              ::size(in_stack_ffffffffffffff98);
      bVar6 = sVar4 < sVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool SelectionResult::operator<(SelectionResult other) const
{
    Assert(m_waste.has_value());
    Assert(other.m_waste.has_value());
    // As this operator is only used in std::min_element, we want the result that has more inputs when waste are equal.
    return *m_waste < *other.m_waste || (*m_waste == *other.m_waste && m_selected_inputs.size() > other.m_selected_inputs.size());
}